

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

uint64_t anon_unknown.dwarf_8f57c::round_down(uint64_t x,uint64_t b)

{
  bool bVar1;
  ulong uVar2;
  uint64_t r;
  uint64_t b_local;
  uint64_t x_local;
  
  bVar1 = pstore::is_power_of_two<unsigned_long,std::enable_if<true,void>>(b);
  if (!bVar1) {
    pstore::assert_failed
              ("pstore::is_power_of_two (b)",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
               ,0x20);
  }
  uVar2 = x & (b - 1 ^ 0xffffffffffffffff);
  if ((uVar2 <= x) && (uVar2 % b == 0)) {
    return uVar2;
  }
  pstore::assert_failed
            ("r <= x && r % b == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
             ,0x22);
}

Assistant:

constexpr std::uint64_t round_down (std::uint64_t const x, std::uint64_t const b) noexcept {
        PSTORE_ASSERT (pstore::is_power_of_two (b));
        std::uint64_t const r = x & ~(b - 1U);
        PSTORE_ASSERT (r <= x && r % b == 0);
        return r;
    }